

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O2

Constant *
spvtools::opt::anon_unknown_0::FoldClamp3
          (IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  pointer ppCVar1;
  Constant *pCVar2;
  uint32_t uVar3;
  FeatureManager *pFVar4;
  Constant *pCVar5;
  Constant *pCVar6;
  Constant *local_78;
  Constant *local_70;
  BinaryScalarFoldingRule local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (inst->opcode_ != OpExtInst) {
    __assert_fail("inst->opcode() == spv::Op::OpExtInst && \"Expecting an extended instruction.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x622,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp3(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar3 = Instruction::GetSingleWordInOperand(inst,0);
  pFVar4 = IRContext::get_feature_mgr(context);
  if (uVar3 == pFVar4->extinst_importid_GLSLstd450_) {
    ppCVar1 = (constants->
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pCVar5 = ppCVar1[1];
    pCVar2 = ppCVar1[3];
    if (pCVar2 == (Constant *)0x0 || pCVar5 == (Constant *)0x0) {
      pCVar6 = (Constant *)0x0;
    }
    else {
      local_68.super__Function_base._M_functor._8_8_ = 0;
      local_68.super__Function_base._M_functor._M_unused._M_object = FoldMin;
      local_68._M_invoker =
           std::
           _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
           ::_M_invoke;
      local_68.super__Function_base._M_manager =
           std::
           _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
           ::_M_manager;
      uVar3 = Instruction::type_id(inst);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_78 = pCVar5;
      local_70 = pCVar2;
      std::
      vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
      ::_M_range_initialize<spvtools::opt::analysis::Constant_const*const*>
                ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                  *)&local_48,&local_78);
      pCVar5 = FoldFPBinaryOp(&local_68,uVar3,
                              (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                               *)&local_48,context);
      std::
      _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::~_Vector_base((_Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                       *)&local_48);
      if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_68.super__Function_base._M_manager)
                  ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
      }
      pCVar6 = (Constant *)0x0;
      if (pCVar5 == pCVar2) {
        pCVar6 = pCVar2;
      }
    }
    return pCVar6;
  }
  __assert_fail("inst->GetSingleWordInOperand(0) == context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() && \"Expecting a GLSLstd450 extended instruction.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                ,0x625,
                "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp3(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
               );
}

Assistant:

const analysis::Constant* FoldClamp3(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>& constants) {
  assert(inst->opcode() == spv::Op::OpExtInst &&
         "Expecting an extended instruction.");
  assert(inst->GetSingleWordInOperand(0) ==
             context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
         "Expecting a GLSLstd450 extended instruction.");

  const analysis::Constant* x = constants[1];
  const analysis::Constant* max_val = constants[3];

  if (x == nullptr || max_val == nullptr) {
    return nullptr;
  }

  const analysis::Constant* temp =
      FoldFPBinaryOp(FoldMin, inst->type_id(), {x, max_val}, context);
  if (temp == max_val) {
    // We can assume that |min_val| is less than |max_val|.  Therefore, if the
    // result of the max operation is |min_val|, we know the result of the min
    // operation, even if |max_val| is not a constant.
    return max_val;
  }
  return nullptr;
}